

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool llvm::sys::path::remove_dots(SmallVectorImpl<char> *path,bool remove_dot_dot,Style style)

{
  bool bVar1;
  path *this;
  size_t sVar2;
  Style in_R9D;
  StringRef path_00;
  undefined1 local_158 [8];
  SmallString<256U> result;
  StringRef p;
  Style style_local;
  bool remove_dot_dot_local;
  SmallVectorImpl<char> *path_local;
  
  this = (path *)SmallVectorTemplateCommon<char,_void>::data
                           ((SmallVectorTemplateCommon<char,_void> *)path);
  sVar2 = SmallVectorBase::size((SmallVectorBase *)path);
  path_00.Length._0_1_ = remove_dot_dot;
  path_00.Data = (char *)sVar2;
  path_00.Length._1_7_ = 0;
  remove_dots((SmallString<256U> *)local_158,this,path_00,SUB41(style,0),in_R9D);
  bVar1 = SmallVectorImpl<char>::operator==((SmallVectorImpl<char> *)local_158,path);
  if (!bVar1) {
    SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_158);
  }
  path_local._7_1_ = !bVar1;
  SmallString<256U>::~SmallString((SmallString<256U> *)local_158);
  return path_local._7_1_;
}

Assistant:

bool remove_dots(SmallVectorImpl<char> &path, bool remove_dot_dot,
                 Style style) {
  StringRef p(path.data(), path.size());

  SmallString<256> result = remove_dots(p, remove_dot_dot, style);
  if (result == path)
    return false;

  path.swap(result);
  return true;
}